

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O2

Result __thiscall wabt::anon_unknown_4::Validator::CheckModule(Validator *this)

{
  ModuleFieldList *pMVar1;
  SharedValidator *this_00;
  anon_union_16_2_ecfd7102_for_Location_1 *paVar2;
  intrusive_list_base<wabt::ModuleField> *loc;
  TypeEntryKind TVar3;
  ExternalKind kind;
  Module *this_01;
  TypeEntry *base;
  pointer pTVar4;
  pointer pTVar5;
  Type *pTVar6;
  pointer pFVar7;
  Import *base_00;
  Type elem_type;
  pointer ppTVar8;
  ModuleField *pMVar9;
  pointer ppMVar10;
  TypeMut field_00;
  bool bVar11;
  Index IVar12;
  Result RVar13;
  reference pMVar14;
  FuncType *pFVar15;
  StructType *pSVar16;
  ArrayType *pAVar17;
  FuncImport *pFVar18;
  TagImport *pTVar19;
  MemoryImport *pMVar20;
  GlobalImport *pGVar21;
  TableImport *pTVar22;
  const_reference pvVar23;
  Location *pLVar24;
  Type type;
  Type type_00;
  Var *__return_storage_ptr__;
  intrusive_list<wabt::Expr> *elem_expr;
  ModuleField *this_02;
  intrusive_list<wabt::Expr> *this_03;
  Field *field;
  pointer pFVar25;
  Type *pTVar26;
  const_iterator rhs;
  const_iterator rhs_00;
  const_iterator rhs_01;
  const_iterator rhs_02;
  const_iterator rhs_03;
  const_iterator rhs_04;
  const_iterator rhs_05;
  const_iterator rhs_06;
  const_iterator rhs_07;
  const_iterator rhs_08;
  const_iterator rhs_09;
  const_iterator rhs_10;
  string_view name;
  ModuleFieldList *__range2;
  const_iterator __begin2;
  Type local_2f0;
  TypeMut local_2e8;
  TypeMutVector type_muts;
  Var local_270;
  Var local_228;
  Var local_1e0;
  Var local_198;
  Var local_150;
  Var local_108;
  Var local_c0;
  Var local_78;
  
  this_01 = this->current_module_;
  pMVar1 = &this_01->fields;
  __begin2.node_ = (this_01->fields).first_;
  this_00 = &this->validator_;
  __begin2.list_ = pMVar1;
  while( true ) {
    rhs.node_ = (ModuleField *)0x0;
    rhs.list_ = pMVar1;
    bVar11 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=(&__begin2,rhs);
    if (!bVar11) break;
    pMVar14 = intrusive_list<wabt::ModuleField>::const_iterator::operator*(&__begin2);
    if (pMVar14->type_ == Type) {
      base = (TypeEntry *)pMVar14[1]._vptr_ModuleField;
      TVar3 = base->kind_;
      if (TVar3 == Array) {
        pAVar17 = cast<wabt::ArrayType,wabt::TypeEntry>(base);
        field_00.type = (pAVar17->field).type;
        field_00.mutable_ = (pAVar17->field).mutable_;
        field_00._9_3_ = *(undefined3 *)&(pAVar17->field).field_0x29;
        RVar13 = SharedValidator::OnArrayType(this_00,&pMVar14->loc,field_00);
LAB_00130b48:
        (this->result_).enum_ = (uint)(RVar13.enum_ == Error || (this->result_).enum_ == Error);
      }
      else if (TVar3 == Struct) {
        pSVar16 = cast<wabt::StructType,wabt::TypeEntry>(base);
        type_muts.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        type_muts.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        type_muts.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        pFVar7 = (pSVar16->fields).super__Vector_base<wabt::Field,_std::allocator<wabt::Field>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        for (pFVar25 = (pSVar16->fields).
                       super__Vector_base<wabt::Field,_std::allocator<wabt::Field>_>._M_impl.
                       super__Vector_impl_data._M_start; pFVar25 != pFVar7; pFVar25 = pFVar25 + 1) {
          local_2e8.type = pFVar25->type;
          local_2e8.mutable_ = pFVar25->mutable_;
          std::vector<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>::emplace_back<wabt::TypeMut>
                    ((vector<wabt::TypeMut,_std::allocator<wabt::TypeMut>_> *)
                     &type_muts.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>,
                     &local_2e8);
        }
        RVar13 = SharedValidator::OnStructType
                           (this_00,&pMVar14->loc,
                            (Index)(((long)type_muts.
                                           super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)type_muts.
                                          super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>
                                          ._M_impl.super__Vector_impl_data._M_start) / 0xc),
                            type_muts.
                            super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>.
                            _M_impl.super__Vector_impl_data._M_start);
        (this->result_).enum_ = (uint)(RVar13.enum_ == Error || (this->result_).enum_ == Error);
        std::_Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>::~_Vector_base
                  (&type_muts.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>);
      }
      else if (TVar3 == Func) {
        pFVar15 = cast<wabt::FuncType,wabt::TypeEntry>(base);
        pTVar26 = (pFVar15->sig).param_types.
                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pTVar4 = (pFVar15->sig).param_types.
                 super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        pTVar5 = (pFVar15->sig).result_types.
                 super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        pTVar6 = (pFVar15->sig).result_types.
                 super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                 super__Vector_impl_data._M_start;
        IVar12 = Module::GetFuncTypeIndex(this_01,&pFVar15->sig);
        RVar13 = SharedValidator::OnFuncType
                           (this_00,&pMVar14->loc,
                            (Index)((ulong)((long)pTVar4 - (long)pTVar26) >> 3),pTVar26,
                            (Index)((ulong)((long)pTVar5 - (long)pTVar6) >> 3),pTVar6,IVar12);
        goto LAB_00130b48;
      }
    }
    intrusive_list<wabt::ModuleField>::const_iterator::operator++(&__begin2);
  }
  type_muts.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)pMVar1->first_;
  type_muts.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pMVar1;
  do {
    rhs_00.node_ = (ModuleField *)0x0;
    rhs_00.list_ = pMVar1;
    bVar11 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=
                       ((const_iterator *)&type_muts,rhs_00);
    if (!bVar11) {
      type_muts.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)pMVar1->first_;
      type_muts.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)pMVar1;
      while (rhs_01.node_ = (ModuleField *)0x0, rhs_01.list_ = pMVar1,
            bVar11 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=
                               ((const_iterator *)&type_muts,rhs_01), bVar11) {
        pMVar14 = intrusive_list<wabt::ModuleField>::const_iterator::operator*
                            ((const_iterator *)&type_muts);
        if (pMVar14->type_ == Func) {
          GetFuncTypeIndex(&local_108,this,&pMVar14->loc,
                           (FuncDeclaration *)&pMVar14[1].loc.filename._M_str);
          RVar13 = SharedValidator::OnFunction(this_00,&pMVar14->loc,&local_108);
          (this->result_).enum_ = (uint)(RVar13.enum_ == Error || (this->result_).enum_ == Error);
          Var::~Var(&local_108);
        }
        intrusive_list<wabt::ModuleField>::const_iterator::operator++((const_iterator *)&type_muts);
      }
      type_muts.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)pMVar1->first_;
      type_muts.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)pMVar1;
      while (rhs_02.node_ = (ModuleField *)0x0, rhs_02.list_ = pMVar1,
            bVar11 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=
                               ((const_iterator *)&type_muts,rhs_02), bVar11) {
        pMVar14 = intrusive_list<wabt::ModuleField>::const_iterator::operator*
                            ((const_iterator *)&type_muts);
        if (pMVar14->type_ == Table) {
          elem_type.enum_ = pMVar14[1].type_;
          elem_type.type_index_ = *(Index *)&pMVar14[1].field_0x3c;
          RVar13 = SharedValidator::OnTable
                             (this_00,&pMVar14->loc,elem_type,
                              (Limits *)&pMVar14[1].loc.filename._M_str);
          (this->result_).enum_ = (uint)(RVar13.enum_ == Error || (this->result_).enum_ == Error);
        }
        intrusive_list<wabt::ModuleField>::const_iterator::operator++((const_iterator *)&type_muts);
      }
      type_muts.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)pMVar1->first_;
      type_muts.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)pMVar1;
      while (rhs_03.node_ = (ModuleField *)0x0, rhs_03.list_ = pMVar1,
            bVar11 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=
                               ((const_iterator *)&type_muts,rhs_03), bVar11) {
        pMVar14 = intrusive_list<wabt::ModuleField>::const_iterator::operator*
                            ((const_iterator *)&type_muts);
        if (pMVar14->type_ == Memory) {
          RVar13 = SharedValidator::OnMemory
                             (this_00,&pMVar14->loc,(Limits *)&pMVar14[1].loc.filename._M_str,
                              pMVar14[1].type_);
          (this->result_).enum_ = (uint)(RVar13.enum_ == Error || (this->result_).enum_ == Error);
        }
        intrusive_list<wabt::ModuleField>::const_iterator::operator++((const_iterator *)&type_muts);
      }
      __begin2.node_ = pMVar1->first_;
      __begin2.list_ = pMVar1;
      while (rhs_04.node_ = (ModuleField *)0x0, rhs_04.list_ = pMVar1,
            bVar11 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=(&__begin2,rhs_04)
            , bVar11) {
        pMVar14 = intrusive_list<wabt::ModuleField>::const_iterator::operator*(&__begin2);
        if (pMVar14->type_ == Global) {
          RVar13 = SharedValidator::OnGlobal
                             (this_00,&pMVar14->loc,(Type)pMVar14[1].loc.filename._M_str,
                              (bool)pMVar14[1].loc.field_1.field2[0]);
          (this->result_).enum_ = (uint)(RVar13.enum_ == Error || (this->result_).enum_ == Error);
          RVar13 = SharedValidator::BeginInitExpr
                             (this_00,&pMVar14->loc,(Type)pMVar14[1].loc.filename._M_str);
          (this->result_).enum_ = (uint)(RVar13.enum_ == Error || (this->result_).enum_ == Error);
          ExprVisitor::ExprVisitor((ExprVisitor *)&type_muts,&this->super_Delegate);
          RVar13 = ExprVisitor::VisitExprList
                             ((ExprVisitor *)&type_muts,
                              (ExprList *)((long)&pMVar14[1].loc.field_1 + 8));
          (this->result_).enum_ = (uint)(RVar13.enum_ == Error || (this->result_).enum_ == Error);
          RVar13 = SharedValidator::EndInitExpr(this_00);
          (this->result_).enum_ = (uint)(RVar13.enum_ == Error || (this->result_).enum_ == Error);
          ExprVisitor::~ExprVisitor((ExprVisitor *)&type_muts);
        }
        intrusive_list<wabt::ModuleField>::const_iterator::operator++(&__begin2);
      }
      type_muts.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)pMVar1->first_;
      type_muts.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)pMVar1;
      while (rhs_05.node_ = (ModuleField *)0x0, rhs_05.list_ = pMVar1,
            bVar11 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=
                               ((const_iterator *)&type_muts,rhs_05), bVar11) {
        pMVar14 = intrusive_list<wabt::ModuleField>::const_iterator::operator*
                            ((const_iterator *)&type_muts);
        if (pMVar14->type_ == Tag) {
          GetFuncTypeIndex(&local_150,this,&pMVar14->loc,
                           (FuncDeclaration *)&pMVar14[1].loc.filename._M_str);
          RVar13 = SharedValidator::OnTag(this_00,&pMVar14->loc,&local_150);
          (this->result_).enum_ = (uint)(RVar13.enum_ == Error || (this->result_).enum_ == Error);
          Var::~Var(&local_150);
        }
        intrusive_list<wabt::ModuleField>::const_iterator::operator++((const_iterator *)&type_muts);
      }
      type_muts.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)pMVar1->first_;
      type_muts.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)pMVar1;
      while( true ) {
        rhs_06.node_ = (ModuleField *)0x0;
        rhs_06.list_ = pMVar1;
        bVar11 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=
                           ((const_iterator *)&type_muts,rhs_06);
        if (!bVar11) break;
        pMVar14 = intrusive_list<wabt::ModuleField>::const_iterator::operator*
                            ((const_iterator *)&type_muts);
        if (pMVar14->type_ == Export) {
          kind = *(ExternalKind *)&pMVar14[1].loc.filename._M_str;
          Var::Var(&local_198,(Var *)&pMVar14[1].loc.field_1.field_0);
          name._M_str = (char *)pMVar14[1]._vptr_ModuleField;
          name._M_len = (size_t)pMVar14[1].super_intrusive_list_base<wabt::ModuleField>.next_;
          RVar13 = SharedValidator::OnExport(this_00,&pMVar14->loc,kind,&local_198,name);
          (this->result_).enum_ = (uint)(RVar13.enum_ == Error || (this->result_).enum_ == Error);
          Var::~Var(&local_198);
        }
        intrusive_list<wabt::ModuleField>::const_iterator::operator++((const_iterator *)&type_muts);
      }
      type_muts.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)pMVar1->first_;
      type_muts.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)pMVar1;
      while (rhs_07.node_ = (ModuleField *)0x0, rhs_07.list_ = pMVar1,
            bVar11 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=
                               ((const_iterator *)&type_muts,rhs_07), bVar11) {
        pMVar14 = intrusive_list<wabt::ModuleField>::const_iterator::operator*
                            ((const_iterator *)&type_muts);
        if (pMVar14->type_ == Start) {
          Var::Var(&local_1e0,(Var *)(pMVar14 + 1));
          RVar13 = SharedValidator::OnStart(this_00,&pMVar14->loc,&local_1e0);
          (this->result_).enum_ = (uint)(RVar13.enum_ == Error || (this->result_).enum_ == Error);
          Var::~Var(&local_1e0);
        }
        intrusive_list<wabt::ModuleField>::const_iterator::operator++((const_iterator *)&type_muts);
      }
      __begin2.node_ = (this_01->fields).first_;
      local_2f0.enum_ = I64;
      local_2f0.type_index_ = 0;
      __begin2.list_ = pMVar1;
      while( true ) {
        rhs_08.node_ = (ModuleField *)0x0;
        rhs_08.list_ = pMVar1;
        bVar11 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=(&__begin2,rhs_08);
        if (!bVar11) break;
        pMVar14 = intrusive_list<wabt::ModuleField>::const_iterator::operator*(&__begin2);
        if (pMVar14->type_ == ElemSegment) {
          pLVar24 = &pMVar14->loc;
          paVar2 = &pMVar14[1].loc.field_1;
          Var::Var(&local_228,(Var *)&paVar2->field_0);
          RVar13 = SharedValidator::OnElemSegment
                             (this_00,pLVar24,&local_228,
                              *(SegmentKind *)&pMVar14[1]._vptr_ModuleField);
          (this->result_).enum_ = (uint)(RVar13.enum_ == Error || (this->result_).enum_ == Error);
          Var::~Var(&local_228);
          RVar13 = SharedValidator::OnElemSegmentElemType
                             (this_00,pLVar24,*(Type *)((long)&pMVar14[2].loc.field_1 + 8));
          (this->result_).enum_ = (uint)(RVar13.enum_ == Error || (this->result_).enum_ == Error);
          if (*(int *)&pMVar14[1]._vptr_ModuleField == 0) {
            IVar12 = Module::GetTableIndex(this_01,(Var *)&paVar2->field_0);
            ppTVar8 = (this_01->tables).
                      super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
            type.enum_ = I32;
            type.type_index_ = 0;
            if (((ulong)IVar12 <
                 (ulong)((long)(this_01->tables).
                               super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)ppTVar8 >> 3)) &&
               ((ppTVar8[IVar12]->elem_limits).is_64 != false)) {
              type = local_2f0;
            }
            RVar13 = SharedValidator::BeginInitExpr(this_00,pLVar24,type);
            (this->result_).enum_ = (uint)(RVar13.enum_ == Error || (this->result_).enum_ == Error);
            ExprVisitor::ExprVisitor((ExprVisitor *)&type_muts,&this->super_Delegate);
            RVar13 = ExprVisitor::VisitExprList
                               ((ExprVisitor *)&type_muts,(ExprList *)&pMVar14[2].type_);
            (this->result_).enum_ = (uint)(RVar13.enum_ == Error || (this->result_).enum_ == Error);
            RVar13 = SharedValidator::EndInitExpr(this_00);
            (this->result_).enum_ = (uint)(RVar13.enum_ == Error || (this->result_).enum_ == Error);
            ExprVisitor::~ExprVisitor((ExprVisitor *)&type_muts);
          }
          pMVar9 = (ModuleField *)pMVar14[3].loc.filename._M_len;
          for (this_02 = pMVar14[3].super_intrusive_list_base<wabt::ModuleField>.prev_;
              this_02 != pMVar9; this_02 = (ModuleField *)&this_02->loc) {
            pvVar23 = intrusive_list<wabt::Expr>::front((intrusive_list<wabt::Expr> *)this_02);
            RVar13 = SharedValidator::BeginInitExpr
                               (this_00,&pvVar23->loc,*(Type *)((long)&pMVar14[2].loc.field_1 + 8));
            (this->result_).enum_ = (uint)(RVar13.enum_ == Error || (this->result_).enum_ == Error);
            ExprVisitor::ExprVisitor((ExprVisitor *)&type_muts,&this->super_Delegate);
            RVar13 = ExprVisitor::VisitExprList((ExprVisitor *)&type_muts,(ExprList *)this_02);
            (this->result_).enum_ = (uint)(RVar13.enum_ == Error || (this->result_).enum_ == Error);
            RVar13 = SharedValidator::EndInitExpr(this_00);
            (this->result_).enum_ = (uint)(RVar13.enum_ == Error || (this->result_).enum_ == Error);
            ExprVisitor::~ExprVisitor((ExprVisitor *)&type_muts);
          }
        }
        intrusive_list<wabt::ModuleField>::const_iterator::operator++(&__begin2);
      }
      SharedValidator::OnDataCount
                (this_00,(Index)((ulong)((long)(this_01->data_segments).
                                               super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(this_01->data_segments).
                                              super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 3));
      IVar12 = this_01->num_func_imports;
      __begin2.node_ = (this_01->fields).first_;
      __begin2.list_ = pMVar1;
      while( true ) {
        rhs_09.node_ = (ModuleField *)0x0;
        rhs_09.list_ = pMVar1;
        bVar11 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=(&__begin2,rhs_09);
        if (!bVar11) break;
        pMVar14 = intrusive_list<wabt::ModuleField>::const_iterator::operator*(&__begin2);
        if (pMVar14->type_ == Func) {
          loc = &pMVar14[5].super_intrusive_list_base<wabt::ModuleField>;
          this_03 = (intrusive_list<wabt::Expr> *)((long)&pMVar14[4].loc.field_1 + 8);
          pLVar24 = (Location *)loc;
          if (pMVar14[5]._vptr_ModuleField != (_func_int **)0x0) {
            pvVar23 = intrusive_list<wabt::Expr>::back(this_03);
            pLVar24 = &pvVar23->loc;
          }
          RVar13 = SharedValidator::BeginFunctionBody(this_00,(Location *)loc,IVar12);
          (this->result_).enum_ = (uint)(RVar13.enum_ == Error || (this->result_).enum_ == Error);
          pTVar6 = (Type *)pMVar14[3].loc.field_1.field_1.offset;
          for (pTVar26 = (Type *)pMVar14[3].loc.filename._M_str; pTVar26 != pTVar6;
              pTVar26 = (Type *)&pTVar26[1].type_index_) {
            RVar13 = SharedValidator::OnLocalDecl(this_00,(Location *)loc,pTVar26[1].enum_,*pTVar26)
            ;
            (this->result_).enum_ = (uint)(RVar13.enum_ == Error || (this->result_).enum_ == Error);
          }
          IVar12 = IVar12 + 1;
          ExprVisitor::ExprVisitor((ExprVisitor *)&type_muts,&this->super_Delegate);
          RVar13 = ExprVisitor::VisitExprList((ExprVisitor *)&type_muts,this_03);
          (this->result_).enum_ = (uint)(RVar13.enum_ == Error || (this->result_).enum_ == Error);
          RVar13 = SharedValidator::EndFunctionBody(this_00,pLVar24);
          (this->result_).enum_ = (uint)(RVar13.enum_ == Error || (this->result_).enum_ == Error);
          ExprVisitor::~ExprVisitor((ExprVisitor *)&type_muts);
        }
        intrusive_list<wabt::ModuleField>::const_iterator::operator++(&__begin2);
      }
      __begin2.node_ = (this_01->fields).first_;
      __begin2.list_ = pMVar1;
      while( true ) {
        rhs_10.node_ = (ModuleField *)0x0;
        rhs_10.list_ = pMVar1;
        bVar11 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=(&__begin2,rhs_10);
        if (!bVar11) break;
        pMVar14 = intrusive_list<wabt::ModuleField>::const_iterator::operator*(&__begin2);
        if (pMVar14->type_ == DataSegment) {
          paVar2 = &pMVar14[1].loc.field_1;
          Var::Var(&local_270,(Var *)&paVar2->field_0);
          RVar13 = SharedValidator::OnDataSegment
                             (this_00,&pMVar14->loc,&local_270,
                              *(SegmentKind *)&pMVar14[1]._vptr_ModuleField);
          (this->result_).enum_ = (uint)(RVar13.enum_ == Error || (this->result_).enum_ == Error);
          Var::~Var(&local_270);
          if (*(int *)&pMVar14[1]._vptr_ModuleField == 0) {
            IVar12 = Module::GetMemoryIndex(this_01,(Var *)&paVar2->field_0);
            ppMVar10 = (this_01->memories).
                       super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
                       super__Vector_impl_data._M_start;
            type_00.enum_ = I32;
            type_00.type_index_ = 0;
            if (((ulong)IVar12 <
                 (ulong)((long)(this_01->memories).
                               super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)ppMVar10 >> 3)) &&
               (type_00 = local_2f0, (ppMVar10[IVar12]->page_limits).is_64 == false)) {
              type_00.enum_ = I32;
              type_00.type_index_ = 0;
            }
            RVar13 = SharedValidator::BeginInitExpr(this_00,&pMVar14->loc,type_00);
            (this->result_).enum_ = (uint)(RVar13.enum_ == Error || (this->result_).enum_ == Error);
            ExprVisitor::ExprVisitor((ExprVisitor *)&type_muts,&this->super_Delegate);
            RVar13 = ExprVisitor::VisitExprList
                               ((ExprVisitor *)&type_muts,
                                (ExprList *)((long)&pMVar14[2].loc.field_1 + 8));
            (this->result_).enum_ = (uint)(RVar13.enum_ == Error || (this->result_).enum_ == Error);
            RVar13 = SharedValidator::EndInitExpr(this_00);
            (this->result_).enum_ = (uint)(RVar13.enum_ == Error || (this->result_).enum_ == Error);
            ExprVisitor::~ExprVisitor((ExprVisitor *)&type_muts);
          }
        }
        intrusive_list<wabt::ModuleField>::const_iterator::operator++(&__begin2);
      }
      RVar13 = SharedValidator::EndModule(this_00);
      RVar13.enum_._0_1_ = RVar13.enum_ == Error || (this->result_).enum_ == Error;
      RVar13.enum_._1_3_ = 0;
      (this->result_).enum_ = RVar13.enum_;
      return (Result)RVar13.enum_;
    }
    pMVar14 = intrusive_list<wabt::ModuleField>::const_iterator::operator*
                        ((const_iterator *)&type_muts);
    if (pMVar14->type_ != Import) goto switchD_00130bca_default;
    base_00 = (Import *)pMVar14[1]._vptr_ModuleField;
    switch(base_00->kind_) {
    case First:
      pFVar18 = cast<wabt::FuncImport,wabt::Import>(base_00);
      __return_storage_ptr__ = &local_78;
      GetFuncTypeIndex(__return_storage_ptr__,this,&pMVar14->loc,&(pFVar18->func).decl);
      RVar13 = SharedValidator::OnFunction(this_00,&pMVar14->loc,__return_storage_ptr__);
      goto LAB_00130c30;
    case Table:
      pTVar22 = cast<wabt::TableImport,wabt::Import>(base_00);
      RVar13 = SharedValidator::OnTable
                         (this_00,&pMVar14->loc,(pTVar22->table).elem_type,
                          &(pTVar22->table).elem_limits);
      break;
    case Memory:
      pMVar20 = cast<wabt::MemoryImport,wabt::Import>(base_00);
      RVar13 = SharedValidator::OnMemory
                         (this_00,&pMVar14->loc,&(pMVar20->memory).page_limits,
                          (pMVar20->memory).page_size);
      break;
    case Global:
      pGVar21 = cast<wabt::GlobalImport,wabt::Import>(base_00);
      RVar13 = SharedValidator::OnGlobalImport
                         (this_00,&pMVar14->loc,(pGVar21->global).type,(pGVar21->global).mutable_);
      break;
    case Last:
      pTVar19 = cast<wabt::TagImport,wabt::Import>(base_00);
      __return_storage_ptr__ = &local_c0;
      GetFuncTypeIndex(__return_storage_ptr__,this,&pMVar14->loc,&(pTVar19->tag).decl);
      RVar13 = SharedValidator::OnTag(this_00,&pMVar14->loc,__return_storage_ptr__);
LAB_00130c30:
      (this->result_).enum_ = (uint)(RVar13.enum_ == Error || (this->result_).enum_ == Error);
      Var::~Var(__return_storage_ptr__);
    default:
      goto switchD_00130bca_default;
    }
    (this->result_).enum_ = (uint)(RVar13.enum_ == Error || (this->result_).enum_ == Error);
switchD_00130bca_default:
    intrusive_list<wabt::ModuleField>::const_iterator::operator++((const_iterator *)&type_muts);
  } while( true );
}

Assistant:

Result Validator::CheckModule() {
  const Module* module = current_module_;

  // Type section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<TypeModuleField>(&field)) {
      switch (f->type->kind()) {
        case TypeEntryKind::Func: {
          FuncType* func_type = cast<FuncType>(f->type.get());
          result_ |= validator_.OnFuncType(
              field.loc, func_type->sig.param_types.size(),
              func_type->sig.param_types.data(),
              func_type->sig.result_types.size(),
              func_type->sig.result_types.data(),
              module->GetFuncTypeIndex(func_type->sig));
          break;
        }

        case TypeEntryKind::Struct: {
          StructType* struct_type = cast<StructType>(f->type.get());
          TypeMutVector type_muts;
          for (auto&& field : struct_type->fields) {
            type_muts.push_back(TypeMut{field.type, field.mutable_});
          }
          result_ |= validator_.OnStructType(field.loc, type_muts.size(),
                                             type_muts.data());
          break;
        }

        case TypeEntryKind::Array: {
          ArrayType* array_type = cast<ArrayType>(f->type.get());
          result_ |= validator_.OnArrayType(
              field.loc,
              TypeMut{array_type->field.type, array_type->field.mutable_});
          break;
        }
      }
    }
  }

  // Import section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<ImportModuleField>(&field)) {
      switch (f->import->kind()) {
        case ExternalKind::Func: {
          auto&& func = cast<FuncImport>(f->import.get())->func;
          result_ |= validator_.OnFunction(
              field.loc, GetFuncTypeIndex(field.loc, func.decl));
          break;
        }

        case ExternalKind::Table: {
          auto&& table = cast<TableImport>(f->import.get())->table;
          result_ |=
              validator_.OnTable(field.loc, table.elem_type, table.elem_limits);
          break;
        }

        case ExternalKind::Memory: {
          auto&& memory = cast<MemoryImport>(f->import.get())->memory;
          result_ |= validator_.OnMemory(field.loc, memory.page_limits,
                                         memory.page_size);
          break;
        }

        case ExternalKind::Global: {
          auto&& global = cast<GlobalImport>(f->import.get())->global;
          result_ |= validator_.OnGlobalImport(field.loc, global.type,
                                               global.mutable_);
          break;
        }

        case ExternalKind::Tag: {
          auto&& tag = cast<TagImport>(f->import.get())->tag;
          result_ |= validator_.OnTag(field.loc,
                                      GetFuncTypeIndex(field.loc, tag.decl));
          break;
        }
      }
    }
  }

  // Func section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<FuncModuleField>(&field)) {
      result_ |= validator_.OnFunction(
          field.loc, GetFuncTypeIndex(field.loc, f->func.decl));
    }
  }

  // Table section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<TableModuleField>(&field)) {
      result_ |= validator_.OnTable(field.loc, f->table.elem_type,
                                    f->table.elem_limits);
    }
  }

  // Memory section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<MemoryModuleField>(&field)) {
      result_ |= validator_.OnMemory(field.loc, f->memory.page_limits,
                                     f->memory.page_size);
    }
  }

  // Global section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<GlobalModuleField>(&field)) {
      result_ |=
          validator_.OnGlobal(field.loc, f->global.type, f->global.mutable_);

      // Init expr.
      result_ |= validator_.BeginInitExpr(field.loc, f->global.type);
      ExprVisitor visitor(this);
      result_ |=
          visitor.VisitExprList(const_cast<ExprList&>(f->global.init_expr));
      result_ |= validator_.EndInitExpr();
    }
  }

  // Tag section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<TagModuleField>(&field)) {
      result_ |=
          validator_.OnTag(field.loc, GetFuncTypeIndex(field.loc, f->tag.decl));
    }
  }

  // Export section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<ExportModuleField>(&field)) {
      result_ |= validator_.OnExport(field.loc, f->export_.kind, f->export_.var,
                                     f->export_.name);
    }
  }

  // Start section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<StartModuleField>(&field)) {
      result_ |= validator_.OnStart(field.loc, f->start);
    }
  }

  // Elem segment section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<ElemSegmentModuleField>(&field)) {
      result_ |= validator_.OnElemSegment(field.loc, f->elem_segment.table_var,
                                          f->elem_segment.kind);

      result_ |= validator_.OnElemSegmentElemType(field.loc,
                                                  f->elem_segment.elem_type);

      // Init expr.
      if (f->elem_segment.kind == SegmentKind::Active) {
        Type offset_type = Type::I32;
        Index table_index = module->GetTableIndex(f->elem_segment.table_var);
        if (table_index < module->tables.size() &&
            module->tables[table_index]->elem_limits.is_64) {
          offset_type = Type::I64;
        }
        result_ |= validator_.BeginInitExpr(field.loc, offset_type);
        ExprVisitor visitor(this);
        result_ |= visitor.VisitExprList(
            const_cast<ExprList&>(f->elem_segment.offset));
        result_ |= validator_.EndInitExpr();
      }

      // Element expr.
      for (auto&& elem_expr : f->elem_segment.elem_exprs) {
        result_ |= validator_.BeginInitExpr(elem_expr.front().loc,
                                            f->elem_segment.elem_type);
        ExprVisitor visitor(this);
        result_ |= visitor.VisitExprList(const_cast<ExprList&>(elem_expr));
        result_ |= validator_.EndInitExpr();
      }
    }
  }

  // DataCount section.
  validator_.OnDataCount(module->data_segments.size());

  // Code section.
  Index func_index = module->num_func_imports;
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<FuncModuleField>(&field)) {
      const Location& body_start = f->func.loc;
      const Location& body_end =
          f->func.exprs.empty() ? body_start : f->func.exprs.back().loc;
      result_ |= validator_.BeginFunctionBody(body_start, func_index++);

      for (auto&& decl : f->func.local_types.decls()) {
        result_ |= validator_.OnLocalDecl(body_start, decl.second, decl.first);
      }

      ExprVisitor visitor(this);
      result_ |= visitor.VisitExprList(const_cast<ExprList&>(f->func.exprs));
      result_ |= validator_.EndFunctionBody(body_end);
    }
  }

  // Data segment section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<DataSegmentModuleField>(&field)) {
      result_ |= validator_.OnDataSegment(field.loc, f->data_segment.memory_var,
                                          f->data_segment.kind);

      // Init expr.
      if (f->data_segment.kind == SegmentKind::Active) {
        Type offset_type = Type::I32;
        Index memory_index = module->GetMemoryIndex(f->data_segment.memory_var);
        if (memory_index < module->memories.size() &&
            module->memories[memory_index]->page_limits.is_64) {
          offset_type = Type::I64;
        }
        result_ |= validator_.BeginInitExpr(field.loc, offset_type);
        ExprVisitor visitor(this);
        result_ |= visitor.VisitExprList(
            const_cast<ExprList&>(f->data_segment.offset));
        result_ |= validator_.EndInitExpr();
      }
    }
  }

  result_ |= validator_.EndModule();

  return result_;
}